

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printDisplayLine(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,bool force,bool forceHead)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  type_conflict5 tVar4;
  int iVar5;
  SPxOut *pSVar6;
  int iVar7;
  char *t;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Verbosity old_verbosity;
  SPxOut *local_208;
  double local_200;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  pSVar6 = this->spxout;
  if (pSVar6 == (SPxOut *)0x0) {
    return;
  }
  old_verbosity = pSVar6->m_verbosity;
  if ((int)old_verbosity < 3) {
    return;
  }
  local_1b8.data._M_elems[0] = 3;
  (*pSVar6->_vptr_SPxOut[2])();
  if (forceHead) {
LAB_0021bdc2:
    soplex::operator<<(this->spxout,
                       "type |   time |   iters | facts |    shift | viol sum | viol num | obj value "
                      );
    if (-1 < this->printBasisMetric) {
      soplex::operator<<(this->spxout," | basis metric");
    }
    std::endl<char,std::char_traits<char>>(this->spxout->m_streams[this->spxout->m_verbosity]);
    if (force) {
      if (forceHead) goto LAB_0021c2aa;
    }
    else {
      iVar5 = this->displayLine;
      iVar7 = this->displayFreq;
LAB_0021be23:
      if (iVar5 % iVar7 != 0 || forceHead) goto LAB_0021c2aa;
    }
  }
  else {
    iVar5 = this->displayLine;
    iVar7 = this->displayFreq;
    if (iVar5 % (iVar7 * 0x1e) == 0) goto LAB_0021bdc2;
    if (!force) goto LAB_0021be23;
  }
  t = "  E  |";
  if (this->theType == LEAVE) {
    t = "  L  |";
  }
  soplex::operator<<(this->spxout,t);
  pSVar6 = this->spxout;
  poVar1 = pSVar6->m_streams[pSVar6->m_verbosity];
  lVar2 = *(long *)poVar1;
  *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 1;
  (*this->theTime->_vptr_Timer[6])();
  pSVar6 = soplex::operator<<(pSVar6,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  soplex::operator<<(pSVar6," |");
  pSVar6 = this->spxout;
  poVar1 = pSVar6->m_streams[pSVar6->m_verbosity];
  lVar2 = *(long *)poVar1;
  *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 2;
  *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 0x10) = 8;
  pSVar6 = soplex::operator<<(pSVar6,(this->
                                     super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).iterCount);
  pSVar6 = soplex::operator<<(pSVar6," | ");
  *(undefined8 *)
   (pSVar6->m_streams[pSVar6->m_verbosity] +
   *(long *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) + 0x10) = 5;
  iVar5 = (*((this->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).factor)->_vptr_SLinSolver[0xb])();
  pSVar6 = soplex::operator<<(pSVar6,iVar5);
  pSVar6 = soplex::operator<<(pSVar6," | ");
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6d])(&local_68,this);
  pSVar6 = soplex::operator<<(pSVar6,&local_68);
  local_208 = soplex::operator<<(pSVar6," | ");
  local_200 = 0.0;
  local_1b8.fpclass = cpp_dec_float_finite;
  local_1b8.prec_elem = 10;
  local_1b8.data._M_elems[0] = 0;
  local_1b8.data._M_elems[1] = 0;
  local_1b8.data._M_elems[2] = 0;
  local_1b8.data._M_elems[3] = 0;
  local_1b8.data._M_elems[4] = 0;
  local_1b8.data._M_elems[5] = 0;
  local_1b8.data._M_elems._24_5_ = 0;
  local_1b8.data._M_elems[7]._1_3_ = 0;
  local_1b8.data._M_elems._32_5_ = 0;
  local_1b8._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_1b8,&(this->m_pricingViol).m_backend,&(this->m_pricingViolCo).m_backend);
  tVar4 = boost::multiprecision::operator>
                    (&local_200,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_1b8);
  if (tVar4) {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result.m_backend,0.0,(type *)0x0);
  }
  else {
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,&(this->m_pricingViol).m_backend,&(this->m_pricingViolCo).m_backend
              );
  }
  pSVar6 = soplex::operator<<(local_208,&result);
  pSVar6 = soplex::operator<<(pSVar6," | ");
  *(undefined8 *)
   (pSVar6->m_streams[pSVar6->m_verbosity] +
   *(long *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) + 0x10) = 8;
  iVar5 = 0;
  if (0 < this->m_numViol) {
    iVar5 = this->m_numViol;
  }
  pSVar6 = soplex::operator<<(pSVar6,iVar5);
  pSVar6 = soplex::operator<<(pSVar6," | ");
  *(undefined8 *)
   (pSVar6->m_streams[pSVar6->m_verbosity] +
   *(long *)(*(long *)pSVar6->m_streams[pSVar6->m_verbosity] + -0x18) + 8) = 8;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x5e])(&local_a0,this);
  soplex::operator<<(pSVar6,&local_a0);
  iVar5 = this->printBasisMetric;
  if (iVar5 == 0) {
    pSVar6 = soplex::operator<<(this->spxout," | ");
    poVar1 = pSVar6->m_streams[pSVar6->m_verbosity];
    lVar2 = *(long *)poVar1;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar1 + lVar3 + 0x18) = *(uint *)(poVar1 + lVar3 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 2;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x68])(&local_d8,this,0);
    soplex::operator<<(pSVar6,&local_d8);
    iVar5 = this->printBasisMetric;
  }
  if (iVar5 == 1) {
    pSVar6 = soplex::operator<<(this->spxout," | ");
    poVar1 = pSVar6->m_streams[pSVar6->m_verbosity];
    lVar2 = *(long *)poVar1;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar1 + lVar3 + 0x18) = *(uint *)(poVar1 + lVar3 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 2;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x68])(&local_110,this,1);
    soplex::operator<<(pSVar6,&local_110);
    iVar5 = this->printBasisMetric;
  }
  if (iVar5 == 2) {
    pSVar6 = soplex::operator<<(this->spxout," | ");
    poVar1 = pSVar6->m_streams[pSVar6->m_verbosity];
    lVar2 = *(long *)poVar1;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar1 + lVar3 + 0x18) = *(uint *)(poVar1 + lVar3 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 2;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x68])(&local_148,this,2);
    soplex::operator<<(pSVar6,&local_148);
    iVar5 = this->printBasisMetric;
  }
  if (iVar5 == 3) {
    pSVar6 = soplex::operator<<(this->spxout," | ");
    poVar1 = pSVar6->m_streams[pSVar6->m_verbosity];
    lVar2 = *(long *)poVar1;
    lVar3 = *(long *)(lVar2 + -0x18);
    *(uint *)(poVar1 + lVar3 + 0x18) = *(uint *)(poVar1 + lVar3 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar1 + *(long *)(lVar2 + -0x18) + 8) = 2;
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::getEstimatedCondition
              (&local_180,
               &this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              );
    soplex::operator<<(pSVar6,&local_180);
  }
  std::endl<char,std::char_traits<char>>(this->spxout->m_streams[this->spxout->m_verbosity]);
LAB_0021c2aa:
  this->displayLine = this->displayLine + 1;
  (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
  return;
}

Assistant:

void SPxSolverBase<R>::printDisplayLine(const bool force, const bool forceHead)
{
   SPX_MSG_INFO1((*this->spxout),

                 if(forceHead || displayLine % (displayFreq * 30) == 0)
{
   (*this->spxout)
            << "type |   time |   iters | facts |    shift | viol sum | viol num | obj value ";

      if(printBasisMetric >= 0)
         (*this->spxout) << " | basis metric";

      (*this->spxout) << std::endl;
   }
   if((force || (displayLine % displayFreq == 0)) && !forceHead)
{
   (type() == LEAVE)
      ? (*this->spxout) << "  L  |" : (*this->spxout) << "  E  |";
      (*this->spxout) << std::fixed << std::setw(7) << std::setprecision(1) << time() << " |";
      (*this->spxout) << std::scientific << std::setprecision(2);
      (*this->spxout) << std::setw(8) << this->iteration() << " | "
                      << std::setw(5) << slinSolver()->getFactorCount() << " | "
                      << shift() << " | "
                      << SOPLEX_MAX(0.0, m_pricingViol + m_pricingViolCo) << " | "
                      << std::setw(8) << SOPLEX_MAX(0, m_numViol) << " | "
                      << std::setprecision(8) << value();

      if(printBasisMetric == 0)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(0);

      if(printBasisMetric == 1)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(1);

      if(printBasisMetric == 2)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(2);

      if(printBasisMetric == 3)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) <<
                         basis().getEstimatedCondition();

      (*this->spxout) << std::endl;
   }